

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O1

size_t __thiscall
asio::detail::reactive_socket_service<asio::ip::udp>::receive_from<asio::mutable_buffers_1>
          (reactive_socket_service<asio::ip::udp> *this,implementation_type *impl,
          mutable_buffers_1 *buffers,endpoint_type *sender_endpoint,message_flags flags,
          error_code *ec)

{
  size_t sVar1;
  size_t addr_len;
  
  addr_len = 0x1c;
  sVar1 = socket_ops::sync_recvfrom1
                    ((impl->super_base_implementation_type).socket_,
                     (impl->super_base_implementation_type).state_,
                     (buffers->super_mutable_buffer).data_,(buffers->super_mutable_buffer).size_,
                     flags,sender_endpoint,&addr_len,ec);
  if (ec->_M_value == 0) {
    ip::basic_endpoint<asio::ip::udp>::resize(sender_endpoint,addr_len);
  }
  return sVar1;
}

Assistant:

size_t receive_from(implementation_type& impl,
      const MutableBufferSequence& buffers,
      endpoint_type& sender_endpoint, socket_base::message_flags flags,
      asio::error_code& ec)
  {
    typedef buffer_sequence_adapter<asio::mutable_buffer,
        MutableBufferSequence> bufs_type;

    std::size_t addr_len = sender_endpoint.capacity();
    std::size_t n;
    if (bufs_type::is_single_buffer)
    {
      n = socket_ops::sync_recvfrom1(impl.socket_, impl.state_,
          bufs_type::first(buffers).data(), bufs_type::first(buffers).size(),
          flags, sender_endpoint.data(), &addr_len, ec);
    }
    else
    {
      bufs_type bufs(buffers);
      n = socket_ops::sync_recvfrom(impl.socket_, impl.state_, bufs.buffers(),
          bufs.count(), flags, sender_endpoint.data(), &addr_len, ec);
    }

    if (!ec)
      sender_endpoint.resize(addr_len);

    ASIO_ERROR_LOCATION(ec);
    return n;
  }